

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

int __thiscall GdlGlyphClassDefn::GlyphIDCount(GdlGlyphClassDefn *this)

{
  int iVar1;
  size_type_conflict sVar2;
  reference ppGVar3;
  long in_RDI;
  size_t iglfd;
  int c;
  ulong local_18;
  int local_c;
  
  local_c = 0;
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>::size
                      ((vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_> *)
                       (in_RDI + 0x58));
    if (sVar2 <= local_18) break;
    ppGVar3 = std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>::operator[]
                        ((vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_> *)
                         (in_RDI + 0x58),local_18);
    iVar1 = (*((*ppGVar3)->super_GdlDefn)._vptr_GdlDefn[5])();
    local_c = iVar1 + local_c;
    local_18 = local_18 + 1;
  }
  return local_c;
}

Assistant:

int GdlGlyphClassDefn::GlyphIDCount()
{
	int c = 0;
	for (size_t iglfd = 0; iglfd < m_vpglfdMembers.size(); iglfd++)
		 c += m_vpglfdMembers[iglfd]->GlyphIDCount();
	return c;
}